

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

BOOL __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::IsIdContinueNext
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr startingLocation,
          EncodedCharPtr endOfSource)

{
  bool bVar1;
  bool local_2d;
  codepoint_t local_2c;
  bool ignore;
  EncodedCharPtr puStack_28;
  codepoint_t nextCodepoint;
  EncodedCharPtr endOfSource_local;
  EncodedCharPtr startingLocation_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  puStack_28 = endOfSource;
  endOfSource_local = startingLocation;
  startingLocation_local = (EncodedCharPtr)this;
  bVar1 = TryReadCodePoint<false>(this,&endOfSource_local,endOfSource,&local_2c,&local_2d,&local_2d)
  ;
  if (bVar1) {
    bVar1 = Js::CharClassifier::IsIdContinue(this->charClassifier,local_2c);
    this_local._4_4_ = (uint)bVar1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

inline BOOL IsIdContinueNext(EncodedCharPtr startingLocation, EncodedCharPtr endOfSource)
    {
        codepoint_t nextCodepoint;
        bool ignore;

        if (TryReadCodePoint<false>(startingLocation, endOfSource, &nextCodepoint, &ignore, &ignore))
        {
            return charClassifier->IsIdContinue(nextCodepoint);
        }

        return false;
    }